

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::UnconditionalBranchDirectiveSyntax::isKind(SyntaxKind kind)

{
  return kind == EndIfDirective || kind == ElseDirective;
}

Assistant:

bool UnconditionalBranchDirectiveSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ElseDirective:
        case SyntaxKind::EndIfDirective:
            return true;
        default:
            return false;
    }
}